

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

void split_tiv_multiplicative
               (vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_> *gulitems,OASIS_FLOAT tiv)

{
  double dVar1;
  bool bVar2;
  pointer pgVar3;
  __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
  local_58;
  gulItemIDLoss *local_50;
  double local_48;
  double percentage;
  __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
  local_38;
  __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
  local_30;
  iterator iter;
  double multiplicative_loss;
  double undamaged_value;
  OASIS_FLOAT sum_loss;
  OASIS_FLOAT tiv_local;
  vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_> *gulitems_local;
  
  undamaged_value._0_4_ = 0.0;
  multiplicative_loss = 1.0;
  iter._M_current = (gulItemIDLoss *)0x0;
  local_30._M_current =
       (gulItemIDLoss *)std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::begin(gulitems);
  while( true ) {
    local_38._M_current =
         (gulItemIDLoss *)std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::end(gulitems);
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar2) break;
    pgVar3 = __gnu_cxx::
             __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
             ::operator->(&local_30);
    multiplicative_loss = (1.0 - pgVar3->loss / (double)tiv) * multiplicative_loss;
    pgVar3 = __gnu_cxx::
             __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
             ::operator->(&local_30);
    undamaged_value._0_4_ = (float)((double)undamaged_value._0_4_ + pgVar3->loss);
    percentage = (double)__gnu_cxx::
                         __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
                         ::operator++(&local_30,0);
  }
  iter._M_current = (gulItemIDLoss *)((double)tiv * (1.0 - multiplicative_loss));
  if (0.0 < undamaged_value._0_4_) {
    local_48 = (double)iter._M_current / (double)undamaged_value._0_4_;
    local_50 = (gulItemIDLoss *)
               std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::begin(gulitems);
    local_30._M_current = local_50;
    while( true ) {
      local_58._M_current =
           (gulItemIDLoss *)
           std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::end(gulitems);
      bVar2 = __gnu_cxx::operator!=(&local_30,&local_58);
      dVar1 = local_48;
      if (!bVar2) break;
      pgVar3 = __gnu_cxx::
               __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
               ::operator->(&local_30);
      pgVar3->loss = dVar1 * pgVar3->loss;
      __gnu_cxx::
      __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
      ::operator++(&local_30,0);
    }
  }
  return;
}

Assistant:

void split_tiv_multiplicative(std::vector<gulItemIDLoss> &gulitems, OASIS_FLOAT tiv){
//Split the total insured value (TIV) using a multiplicative formula for the
//total loss as tiv * (1 - (1-A)*(1-B)*(1-C)...), where A, B, C are damage ratios
//computed as the ratio between a sub-peril loss and the tiv. Sub-peril losses
//in gulitems are always back-allocated proportionally to the losses.
    OASIS_FLOAT sum_loss = 0;
    double undamaged_value = 1;
    double multiplicative_loss = 0;

    auto iter = gulitems.begin();
	while (iter != gulitems.end()) {
	    undamaged_value *= 1 - iter->loss / tiv;
        sum_loss += iter->loss;
        iter++;
	}
    multiplicative_loss = tiv * (1. - undamaged_value);

    if (sum_loss > 0) {
        double percentage = multiplicative_loss / sum_loss;
        iter = gulitems.begin();
        while (iter != gulitems.end()) {
            iter->loss *= percentage;
            iter++;
        }
    }
}